

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsItem * __thiscall QGraphicsItem::clipPath(QGraphicsItem *this)

{
  long lVar1;
  bool bVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  ulong uVar5;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *lastParent;
  QGraphicsItem *parent;
  QGraphicsItemPrivate *d;
  QPainterPath *clip;
  QRectF thisBoundingRect;
  QGraphicsItem *this_00;
  QGraphicsItem *local_128;
  QGraphicsItem *local_120;
  QPainterPath local_f8 [8];
  QPainterPath local_f0 [8];
  QPainterPath local_e8 [8];
  QPainterPath local_e0 [8];
  QPainterPath local_d8 [8];
  QPainterPath local_d0 [8];
  qreal local_c8;
  qreal local_c0;
  qreal local_b8;
  bool *ok;
  QGraphicsItem *in_stack_ffffffffffffff58;
  QGraphicsItem *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QGraphicsItem *)0x980981);
  bVar2 = isClipped(this_00);
  if (bVar2) {
    local_c8 = -NAN;
    local_c0 = -NAN;
    local_b8 = -NAN;
    ok = (bool *)0xffffffffffffffff;
    (*in_RSI->_vptr_QGraphicsItem[3])(&local_c8);
    bVar2 = QRectF::isEmpty((QRectF *)&local_c8);
    if (bVar2) {
      QPainterPath::QPainterPath((QPainterPath *)in_RDI);
    }
    else {
      in_RDI->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)in_RDI);
      QPainterPath::addRect((QRectF *)in_RDI);
      local_128 = in_RSI;
      local_120 = in_RSI;
      if ((*(ulong *)&pQVar3->field_0x160 & 0x20000) != 0) {
        do {
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&local_120->d_ptr);
          local_120 = pQVar4->parent;
          if (local_120 == (QGraphicsItem *)0x0) break;
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&local_120->d_ptr);
          if ((*(ulong *)&pQVar4->field_0x160 & 0x1000000000) != 0) {
            itemTransform(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,ok);
            QTransform::map(local_d0);
            QPainterPath::operator=((QPainterPath *)this_00,(QPainterPath *)in_RDI);
            QPainterPath::~QPainterPath(local_d0);
            (*local_120->_vptr_QGraphicsItem[4])(local_e0);
            QPainterPath::intersected(local_d8);
            QPainterPath::operator=((QPainterPath *)this_00,(QPainterPath *)in_RDI);
            QPainterPath::~QPainterPath(local_d8);
            QPainterPath::~QPainterPath(local_e0);
            uVar5 = QPainterPath::isEmpty();
            local_128 = local_120;
            if ((uVar5 & 1) != 0) goto LAB_00980c77;
          }
          pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&local_120->d_ptr);
        } while ((*(ulong *)&pQVar4->field_0x160 & 0x20000) != 0);
        if (local_128 != in_RSI) {
          itemTransform(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,ok);
          QTransform::map(local_e8);
          QPainterPath::operator=((QPainterPath *)this_00,(QPainterPath *)in_RDI);
          QPainterPath::~QPainterPath(local_e8);
        }
      }
      if ((*(ulong *)&pQVar3->field_0x160 & 0x800000000) != 0) {
        (*in_RSI->_vptr_QGraphicsItem[4])(local_f8);
        QPainterPath::intersected(local_f0);
        QPainterPath::operator=((QPainterPath *)this_00,(QPainterPath *)in_RDI);
        QPainterPath::~QPainterPath(local_f0);
        QPainterPath::~QPainterPath(local_f8);
      }
    }
  }
  else {
    QPainterPath::QPainterPath((QPainterPath *)in_RDI);
  }
LAB_00980c77:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsItem::clipPath() const
{
    Q_D(const QGraphicsItem);
    if (!isClipped())
        return QPainterPath();

    const QRectF thisBoundingRect(boundingRect());
    if (thisBoundingRect.isEmpty())
        return QPainterPath();

    QPainterPath clip;
    // Start with the item's bounding rect.
    clip.addRect(thisBoundingRect);

    if (d->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren) {
        const QGraphicsItem *parent = this;
        const QGraphicsItem *lastParent = this;

        // Intersect any in-between clips starting at the top and moving downwards.
        while ((parent = parent->d_ptr->parent)) {
            if (parent->d_ptr->flags & ItemClipsChildrenToShape) {
                // Map clip to the current parent and intersect with its shape/clipPath
                clip = lastParent->itemTransform(parent).map(clip);
                clip = clip.intersected(parent->shape());
                if (clip.isEmpty())
                    return clip;
                lastParent = parent;
            }

            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren))
                break;
        }

        if (lastParent != this) {
            // Map clip back to the item's transform.
            // ### what if itemtransform fails
            clip = lastParent->itemTransform(this).map(clip);
        }
    }

    if (d->flags & ItemClipsToShape)
        clip = clip.intersected(shape());

    return clip;
}